

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
          (internal *this,char *lhs_expression,char *rhs_expression,bool *lhs,shared_ptr<A> *rhs)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  AssertionResult AVar5;
  shared_ptr<A> *rhs_local;
  bool *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = *lhs;
  bVar3 = shared_ptr::operator_cast_to_bool((shared_ptr *)rhs);
  if ((bool)(bVar1 & 1U) == bVar3) {
    AVar5 = AssertionSuccess();
    sVar4 = AVar5.message_.ptr_;
  }
  else {
    AVar5 = CmpHelperEQFailure<bool,shared_ptr<A>>(this,lhs_expression,rhs_expression,lhs,rhs);
    sVar4 = AVar5.message_.ptr_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    AVar5.message_.ptr_ = sVar4.ptr_;
    AVar5._0_8_ = this;
    return AVar5;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}